

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4f7cf6::BuildEngineImpl::cancelRemainingTasks(BuildEngineImpl *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  _Hash_node_base *p_Var3;
  pointer pRVar4;
  _Elt_pointer pTVar5;
  _Map_pointer ppTVar6;
  _Map_pointer ppTVar7;
  pointer pTVar8;
  _Elt_pointer ppTVar9;
  _Map_pointer pppTVar10;
  _Map_pointer pppTVar11;
  int iVar12;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  _Map_pointer ppTVar15;
  _Map_pointer pppTVar16;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_58;
  _Elt_pointer local_48;
  _Elt_pointer pTStack_40;
  
  if (this->numOutstandingUnfinishedTasks != 0) {
    do {
      local_58._M_owns = false;
      local_58._M_device = &this->finishedTaskInfosMutex;
      std::unique_lock<std::mutex>::lock(&local_58);
      local_58._M_owns = true;
      ppTVar1 = (this->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = (this->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar1 == ppTVar2) {
        std::condition_variable::wait((unique_lock *)&this->finishedTaskInfosCondition);
        if ((local_58._M_owns & 1U) != 0) goto LAB_001cd989;
      }
      else {
        uVar14 = (long)ppTVar2 - (long)ppTVar1 >> 3;
        if (this->numOutstandingUnfinishedTasks < uVar14) {
          __assert_fail("finishedTaskInfos.size() <= numOutstandingUnfinishedTasks",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x53b,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()"
                       );
        }
        this->numOutstandingUnfinishedTasks = this->numOutstandingUnfinishedTasks - (int)uVar14;
        (this->finishedTaskInfos).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
LAB_001cd989:
        std::unique_lock<std::mutex>::unlock(&local_58);
      }
    } while (this->numOutstandingUnfinishedTasks != 0);
  }
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->taskInfosMutex);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  p_Var13 = (this->taskInfos)._M_h._M_before_begin._M_nxt;
  while( true ) {
    if (p_Var13 == (_Hash_node_base *)0x0) {
      for (p_Var13 = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
          p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
        if (*(int *)&p_Var13[0x13]._M_nxt == 1) {
          *(undefined4 *)&p_Var13[0x13]._M_nxt = 0;
        }
      }
      pRVar4 = (this->ruleInfosToScan).
               super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->ruleInfosToScan).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
        (this->ruleInfosToScan).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish = pRVar4;
      }
      local_48 = (this->inputRequests).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pTStack_40 = (this->inputRequests).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
      pTVar5 = (this->inputRequests).
               super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppTVar7 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppTVar6 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      for (ppTVar15 = ppTVar6; ppTVar15 < ppTVar7; ppTVar15 = ppTVar15 + 1) {
        operator_delete(ppTVar15[1],0x200);
      }
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = local_48;
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pTStack_40;
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pTVar5;
      (this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppTVar6;
      pTVar8 = (this->finishedInputRequests).
               super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->finishedInputRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
        (this->finishedInputRequests).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar8;
      }
      local_48 = (_Elt_pointer)
                 (this->readyTaskInfos).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pTStack_40 = (_Elt_pointer)
                   (this->readyTaskInfos).
                   super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
      ppTVar9 = (this->readyTaskInfos).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      pppTVar11 = (this->readyTaskInfos).
                  super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
      pppTVar10 = (this->readyTaskInfos).
                  super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      for (pppTVar16 = pppTVar10; pppTVar16 < pppTVar11; pppTVar16 = pppTVar16 + 1) {
        operator_delete(pppTVar16[1],0x200);
      }
      (this->readyTaskInfos).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = &local_48->taskInfo;
      (this->readyTaskInfos).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = &pTStack_40->taskInfo;
      (this->readyTaskInfos).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = ppTVar9;
      (this->readyTaskInfos).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = pppTVar10;
      ppTVar1 = (this->finishedTaskInfos).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->finishedTaskInfos).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
        (this->finishedTaskInfos).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
      }
      std::
      _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->taskInfos)._M_h);
      pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
      return;
    }
    p_Var3 = p_Var13[9]._M_nxt;
    if (((ulong)p_Var3[0x11]._M_nxt & 0xfffffffe) != 4) break;
    if (p_Var13 + 2 != p_Var3[2]._M_nxt) {
      __assert_fail("taskInfo == ruleInfo->getPendingTaskInfo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                    ,0x553,"void (anonymous namespace)::BuildEngineImpl::cancelRemainingTasks()");
    }
    p_Var3[2]._M_nxt = (_Hash_node_base *)0x0;
    *(undefined4 *)&p_Var3[0x11]._M_nxt = 0;
    p_Var13 = p_Var13->_M_nxt;
  }
  __assert_fail("isInProgress()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                ,0x119,
                "TaskInfo *(anonymous namespace)::BuildEngineImpl::RuleInfo::getPendingTaskInfo()");
}

Assistant:

void cancelRemainingTasks() {
    // We need to wait for any currently running tasks to be reported as
    // complete. Not doing this would mean we could get asynchronous calls
    // attempting to modify the task state concurrently with the cancellation
    // process, which isn't something we want to need to synchronize on.
    //
    // We don't process the requests at all, we simply drain them. In practice,
    // we expect clients to implement cancellation in conjection with causing
    // long-running tasks to also cancel and fail, so preserving those results
    // is not valuable.
    while (numOutstandingUnfinishedTasks != 0) {
        std::unique_lock<std::mutex> lock(finishedTaskInfosMutex);
        if (finishedTaskInfos.empty()) {
          finishedTaskInfosCondition.wait(lock);
        } else {
          assert(finishedTaskInfos.size() <= numOutstandingUnfinishedTasks);
          numOutstandingUnfinishedTasks -= finishedTaskInfos.size();
          finishedTaskInfos.clear();
        }
    }

    std::lock_guard<std::mutex> guard(taskInfosMutex);

    for (auto& it: taskInfos) {
      // Cancel the task, marking it incomplete.
      //
      // This will force it to rerun in a later build, but since it was already
      // running in this build that was almost certainly going to be
      // required. Technically, there are rare situations where it wouldn't have
      // to rerun (e.g., if resultIsValid becomes true after being false in this
      // run), and if we were willing to restore the tasks state--either by
      // keeping the old one or by restoring from the database--we could ensure
      // that doesn't happen.
      //
      // NOTE: Actually, we currently don't sync this write to the database, so
      // in some cases we do actually preserve this information (if the client
      // ends up cancelling, then reloading froom the database).
      TaskInfo* taskInfo = &it.second;
      RuleInfo* ruleInfo = taskInfo->forRuleInfo;
      assert(taskInfo == ruleInfo->getPendingTaskInfo());
      ruleInfo->setPendingTaskInfo(nullptr);
      ruleInfo->setCancelled();
    }

    // FIXME: This is currently an O(n) operation that could be relatively
    // expensive on larger projects.  We should be able to do something more
    // targeted. rdar://problem/39386591
    for (auto& it: ruleInfos) {
      // Cancel outstanding activity on rules
      if (it.second.isScanning()) {
        it.second.setCancelled();
      }
    }

    // Delete all of the tasks.
    ruleInfosToScan.clear();
    inputRequests.clear();
    finishedInputRequests.clear();
    readyTaskInfos.clear();
    finishedTaskInfos.clear();
    taskInfos.clear();
  }